

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commandline.cpp
# Opt level: O0

StringList * __thiscall
CommandLine::process(StringList *__return_storage_ptr__,CommandLine *this,int argc,char **argv)

{
  CommandLineOption *pCVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  CommandLineOption **ppCVar6;
  long lVar7;
  String local_240;
  anon_class_8_1_898f2789 local_220;
  function<bool_(CommandLineOption_*const_&)> local_218;
  CommandLineOption **local_1f8;
  CommandLineOption **optionptr_1;
  String local_1d0;
  String local_1b0;
  int local_18c;
  undefined1 local_188 [4];
  int idx;
  String value;
  String name;
  String local_128;
  String local_108;
  String local_e8;
  CommandLineOption *local_c8;
  CommandLineOption *option;
  CommandLineOption ***local_b8;
  function<bool_(CommandLineOption_*const_&)> local_b0;
  CommandLineOption **local_90;
  CommandLineOption **optionptr;
  int i;
  undefined1 local_50 [8];
  String arg;
  int argn;
  char **argv_local;
  int argc_local;
  CommandLine *this_local;
  StringList *args;
  
  arg._31_1_ = 0;
  StringList::StringList(__return_storage_ptr__);
  arg._24_4_ = 1;
  while( true ) {
    if (argc <= (int)arg._24_4_) {
      return __return_storage_ptr__;
    }
    String::String((String *)local_50,argv[(int)arg._24_4_]);
    bVar3 = String::operator==((String *)local_50,"--");
    if (bVar3) {
      while (arg._24_4_ = arg._24_4_ + 1, (int)arg._24_4_ < argc) {
        String::String((String *)&i,argv[(int)arg._24_4_]);
        List<String>::operator<<(&__return_storage_ptr__->super_List<String>,(String *)&i);
        String::~String((String *)&i);
      }
      optionptr._4_4_ = 2;
    }
    else {
      pcVar5 = String::operator_cast_to_char_((String *)local_50);
      if ((*pcVar5 == '-') &&
         (pcVar5 = String::operator_cast_to_char_((String *)local_50), pcVar5[1] != '\0')) {
        pcVar5 = String::operator_cast_to_char_((String *)local_50);
        if ((pcVar5[1] == '-') ||
           (pcVar5 = String::operator_cast_to_char_((String *)local_50), pcVar5[1] == '\0')) {
          String::String((String *)&value.field_0x18);
          String::String((String *)local_188);
          local_18c = String::firstIndexOf((String *)local_50,"=",2);
          if (local_18c == -1) {
            String::mid((String *)&optionptr_1,(String *)local_50,2,-1);
            String::operator=((String *)&value.field_0x18,(String *)&optionptr_1);
            String::~String((String *)&optionptr_1);
          }
          else {
            String::mid(&local_1b0,(String *)local_50,2,(long)local_18c);
            String::operator=((String *)&value.field_0x18,&local_1b0);
            String::~String(&local_1b0);
            String::mid(&local_1d0,(String *)local_50,(long)(local_18c + 1),-1);
            String::operator=((String *)local_188,&local_1d0);
            String::~String(&local_1d0);
          }
          local_220.name = (String *)&value.field_0x18;
          std::function<bool(CommandLineOption*const&)>::
          function<CommandLine::process(int,char**)::__1,void>
                    ((function<bool(CommandLineOption*const&)> *)&local_218,&local_220);
          ppCVar6 = List<CommandLineOption_*>::find(&this->_options,&local_218);
          std::function<bool_(CommandLineOption_*const_&)>::~function(&local_218);
          local_1f8 = ppCVar6;
          if (ppCVar6 == (CommandLineOption **)0x0) {
            error<String>("unknown option --%1",(String *)&value.field_0x18);
          }
          bVar3 = CommandLineOption::isOfType<bool>(*local_1f8);
          if ((bVar3) && (bVar3 = String::isEmpty((String *)local_188), !bVar3)) {
            CommandLineOption::describe(&local_240,*local_1f8);
            error<String>("option %1 does not take a value",&local_240);
            String::~String(&local_240);
          }
          (*(*local_1f8)->_vptr_CommandLineOption[2])(*local_1f8,local_188);
          String::~String((String *)local_188);
          String::~String((String *)&value.field_0x18);
        }
        else {
          for (optionptr._0_4_ = 1; iVar2 = (int)optionptr,
              iVar4 = String::length((String *)local_50), iVar2 < iVar4;
              optionptr._0_4_ = (int)optionptr + 1) {
            option = (CommandLineOption *)local_50;
            local_b8 = &optionptr;
            std::function<bool(CommandLineOption*const&)>::
            function<CommandLine::process(int,char**)::__0,void>
                      ((function<bool(CommandLineOption*const&)> *)&local_b0,
                       (anon_class_16_2_de2d36fc *)&option);
            ppCVar6 = List<CommandLineOption_*>::find(&this->_options,&local_b0);
            std::function<bool_(CommandLineOption_*const_&)>::~function(&local_b0);
            local_90 = ppCVar6;
            if (ppCVar6 == (CommandLineOption **)0x0) {
              pcVar5 = String::operator_cast_to_char_((String *)local_50);
              error<char>("unknown option -%1",pcVar5 + (int)optionptr);
            }
            local_c8 = *local_90;
            bVar3 = CommandLineOption::isOfType<bool>(local_c8);
            pCVar1 = local_c8;
            if (bVar3) {
              String::String(&local_e8,"");
              (*pCVar1->_vptr_CommandLineOption[2])(pCVar1,&local_e8);
              String::~String(&local_e8);
            }
            else {
              if (arg._24_4_ == argc + -1) {
                CommandLineOption::describe(&local_108,local_c8);
                error<String>("option -%1 requires a parameter",&local_108);
                String::~String(&local_108);
              }
              iVar2 = (int)optionptr;
              iVar4 = String::length((String *)local_50);
              if (iVar2 != iVar4 + -1) {
                CommandLineOption::describe(&local_128,local_c8);
                pcVar5 = String::operator_cast_to_char_((String *)local_50);
                error<String,char>("option %1 requires a parameter but has option -%2 stacked on",
                                   &local_128,pcVar5 + (long)(int)optionptr + 1);
                String::~String(&local_128);
              }
              pCVar1 = local_c8;
              lVar7 = (long)(int)arg._24_4_;
              arg._24_4_ = arg._24_4_ + 1;
              String::String((String *)&name.field_0x18,argv[lVar7 + 1]);
              (*pCVar1->_vptr_CommandLineOption[2])(pCVar1,&name.field_0x18);
              String::~String((String *)&name.field_0x18);
            }
          }
        }
        optionptr._4_4_ = 0;
      }
      else {
        List<String>::operator<<(&__return_storage_ptr__->super_List<String>,(String *)local_50);
        optionptr._4_4_ = 4;
      }
    }
    String::~String((String *)local_50);
    if ((optionptr._4_4_ != 0) && (optionptr._4_4_ == 2)) break;
    arg._24_4_ = arg._24_4_ + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

StringList CommandLine::process (int const argc, char* argv[])
{
	StringList args;

	for (int argn = 1; argn < argc; ++argn)
	{
		String const arg (argv[argn]);

		if (arg == "--")
		{
			// terminating option - write everything to args and be done with it.
			while (++argn < argc)
				args << argv[argn];

			break;
		}

		if (arg[0] != '-' or arg[1] == '\0')
		{
			// non-option argument - pass to result
			args << arg;
			continue;
		}

		if (arg[1] != '-' and arg[1] != '\0')
		{
			// short-form options
			for (int i = 1; i < arg.length(); ++i)
			{
				CommandLineOption** optionptr = _options.find ([&](CommandLineOption* const& a)
				{
					return arg[i] == a->shortform();
				});

				if (not optionptr)
					error ("unknown option -%1", arg[i]);

				CommandLineOption* option = *optionptr;

				if (option->isOfType<bool>())
				{
					// Bool options need no parameters
					option->handleValue ("");
				}
				else
				{
					// Ensure we got a valid parameter coming up
					if (argn == argc - 1)
						error ("option -%1 requires a parameter", option->describe());

					if (i != arg.length() - 1)
					{
						error ("option %1 requires a parameter but has option -%2 stacked on",
							option->describe(), arg[i + 1]);
					}

					option->handleValue (argv[++argn]);
				}
			}
		}
		else
		{
			// long-form options
			String name, value;
			{
				int idx = arg.firstIndexOf ("=", 2);

				if (idx != -1)
				{
					name = arg.mid (2, idx);
					value = arg.mid (idx + 1);
				}
				else
				{
					name = arg.mid (2);
				}
			}

			CommandLineOption** optionptr = _options.find ([&](CommandLineOption* const& a)
			{
				return a->longform() == name;
			});

			if (not optionptr)
				error ("unknown option --%1", name);

			if ((*optionptr)->isOfType<bool>() and not value.isEmpty())
				error ("option %1 does not take a value", (*optionptr)->describe());
 
			(*optionptr)->handleValue (value);
		}
	}

	return args;
}